

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O3

void __thiscall polyscope::SlicePlane::setSliceAttributes(SlicePlane *this,ShaderProgram *p)

{
  uint *puVar1;
  pointer pcVar2;
  pointer paVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  VolumeMesh *pVVar5;
  pointer paVar6;
  array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL> *paVar7;
  long lVar8;
  size_type __new_size;
  long lVar9;
  undefined1 *indices;
  undefined1 local_110 [8];
  _Alloc_hider local_108;
  undefined1 local_100 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  ManagedBufferRegistry *local_d0 [2];
  undefined1 local_c0 [32];
  undefined1 local_a0 [16];
  element_type *local_90 [2];
  undefined1 local_80 [16];
  element_type *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  pcVar2 = (this->inspectedMeshName)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (this->inspectedMeshName)._M_string_length);
  pVVar5 = getVolumeMesh(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  paVar6 = (pVVar5->cells).
           super__Vector_base<std::array<unsigned_int,_8UL>,_std::allocator<std::array<unsigned_int,_8UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  paVar3 = (pVVar5->cells).
           super__Vector_base<std::array<unsigned_int,_8UL>,_std::allocator<std::array<unsigned_int,_8UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar9 = 0;
  __new_size = (long)paVar6 - (long)paVar3 >> 5;
  do {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(this->sliceBufferDataArr)._M_elems[0].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar9),__new_size);
    lVar9 = lVar9 + 0x18;
  } while (lVar9 != 0x60);
  if (paVar6 != paVar3) {
    paVar6 = (pVVar5->cells).
             super__Vector_base<std::array<unsigned_int,_8UL>,_std::allocator<std::array<unsigned_int,_8UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      lVar8 = 0;
      paVar7 = &this->sliceBufferDataArr;
      do {
        puVar1 = paVar6->_M_elems + lVar8;
        pvVar4 = paVar7->_M_elems;
        lVar8 = lVar8 + 1;
        paVar7 = (array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL> *)
                 (paVar7->_M_elems + 1);
        (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar9] = *puVar1;
      } while (lVar8 != 4);
      lVar9 = lVar9 + 1;
      paVar6 = paVar6 + 1;
    } while (lVar9 != __new_size + (__new_size == 0));
  }
  lVar9 = 0;
  do {
    render::ManagedBuffer<unsigned_int>::markHostBufferUpdated
              ((ManagedBuffer<unsigned_int> *)
               (&((array<polyscope::render::ManagedBuffer<unsigned_int>,_4UL> *)
                 (&this->sliceBufferDataArr + 1))->field_0x0 + lVar9));
    lVar9 = lVar9 + 0xe8;
  } while (lVar9 != 0x3a0);
  local_70[0] = (element_type *)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"a_slice_1","");
  indices = &(pVVar5->super_QuantityStructure<polyscope::VolumeMesh>).field_0x428;
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)(local_e8 + 8),
             (ManagedBuffer<unsigned_int> *)indices);
  (*p->_vptr_ShaderProgram[0x13])(p,local_70,local_e8 + 8);
  if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
  }
  if (local_70[0] != (element_type *)local_60) {
    operator_delete(local_70[0]);
  }
  local_90[0] = (element_type *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"a_slice_2","");
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)(local_f8._M_local_buf + 8),
             (ManagedBuffer<unsigned_int> *)indices);
  (*p->_vptr_ShaderProgram[0x13])(p,local_90,local_f8._M_local_buf + 8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._0_8_);
  }
  if (local_90[0] != (element_type *)local_80) {
    operator_delete(local_90[0]);
  }
  local_c0._16_8_ = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_c0 + 0x10),"a_slice_3","");
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_100,
             (ManagedBuffer<unsigned_int> *)indices);
  (*p->_vptr_ShaderProgram[0x13])(p,local_c0 + 0x10,local_100);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_allocated_capacity);
  }
  if ((undefined1 *)local_c0._16_8_ != local_a0) {
    operator_delete((void *)local_c0._16_8_);
  }
  local_d0[0] = (ManagedBufferRegistry *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"a_slice_4","");
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_110,
             (ManagedBuffer<unsigned_int> *)indices);
  (*p->_vptr_ShaderProgram[0x13])(p,local_d0,local_110);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_p);
  }
  if (local_d0[0] != (ManagedBufferRegistry *)local_c0) {
    operator_delete(local_d0[0]);
  }
  return;
}

Assistant:

void SlicePlane::setSliceAttributes(render::ShaderProgram& p) {
  VolumeMesh* meshToInspect = polyscope::getVolumeMesh(inspectedMeshName);


  size_t cellCount = meshToInspect->nCells();
  for (int i = 0; i < 4; i++) {
    sliceBufferDataArr[i].resize(cellCount);
  }
  for (size_t iC = 0; iC < cellCount; iC++) {
    const std::array<uint32_t, 8>& cell = meshToInspect->cells[iC];
    for (int i = 0; i < 4; i++) {
      sliceBufferDataArr[i][iC] = cell[i];
    }
  }

  for (int i = 0; i < 4; i++) {
    sliceBufferArr[i].markHostBufferUpdated();
  }

  p.setAttribute("a_slice_1", meshToInspect->vertexPositions.getIndexedRenderAttributeBuffer(sliceBufferArr[0]));
  p.setAttribute("a_slice_2", meshToInspect->vertexPositions.getIndexedRenderAttributeBuffer(sliceBufferArr[1]));
  p.setAttribute("a_slice_3", meshToInspect->vertexPositions.getIndexedRenderAttributeBuffer(sliceBufferArr[2]));
  p.setAttribute("a_slice_4", meshToInspect->vertexPositions.getIndexedRenderAttributeBuffer(sliceBufferArr[3]));
}